

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O1

int Ivy_ManRewritePre(Ivy_Man_t *p,int fUpdateLevel,int fUseZeroCost,int fVerbose)

{
  char cVar1;
  short sVar2;
  char *pcVar3;
  long lVar4;
  Ivy_Obj_t *pIVar5;
  Vec_Int_t *__ptr;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Rwt_Man_t *p_00;
  Ivy_Store_t *pIVar10;
  void **ppvVar11;
  Ivy_Obj_t *pIVar12;
  Ivy_Obj_t *pIVar13;
  Vec_Ptr_t *pVVar14;
  Dec_Graph_t *pGraph;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Ivy_Cut_t *pIVar20;
  Ivy_Obj_t *pIVar21;
  uint uVar22;
  Ivy_Obj_t *pIVar23;
  void *pvVar24;
  int *piVar25;
  long lVar26;
  int *piVar27;
  Ivy_Obj_t *pIVar28;
  timespec ts;
  timespec local_110;
  int local_fc;
  int local_f8;
  int local_f4;
  Ivy_Obj_t *local_f0;
  uint local_e4;
  ulong local_e0;
  Ivy_Store_t *local_d8;
  long local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  Ivy_Cut_t *local_b8;
  int *local_b0;
  Rwt_Man_t *local_a8;
  void *local_a0;
  long local_98;
  int *local_90;
  long local_88;
  long local_80;
  ulong local_78;
  int local_6c;
  uint local_68;
  int local_64;
  ulong local_60;
  long local_58;
  Ivy_Obj_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_fc = fUpdateLevel;
  local_c8 = fUseZeroCost;
  local_6c = fVerbose;
  iVar6 = clock_gettime(3,&local_110);
  if (iVar6 < 0) {
    local_88 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
    local_88 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_110.tv_sec * -1000000;
  }
  iVar6 = 0;
  p_00 = Rwt_ManStart(0);
  p->pData = p_00;
  if (p_00 != (Rwt_Man_t *)0x0) {
    local_a8 = p_00;
    if (local_fc != 0) {
      if (p->fFanout == 0) {
        Ivy_ManStartFanout(p);
      }
      Ivy_ManRequiredLevels(p);
    }
    pVVar14 = p->vObjs;
    local_60 = (ulong)pVVar14->nSize;
    if (0 < (long)local_60) {
      local_50 = &p->Ghost;
      uVar15 = 0;
      do {
        pIVar23 = (Ivy_Obj_t *)pVVar14->pArray[uVar15];
        if (((pIVar23 != (Ivy_Obj_t *)0x0) &&
            (0xfffffffd < (*(uint *)&pIVar23->field_0x8 & 0xf) - 7)) &&
           (local_f0 = pIVar23, local_e0 = uVar15, Ivy_NodeFixBufferFanins(p,pIVar23,1),
           uVar15 = local_e0, (*(uint *)&local_f0->field_0x8 & 0xf) != 7)) {
          if (local_60 <= local_e0) break;
          p_00->nNodesConsidered = p_00->nNodesConsidered + 1;
          if (local_fc == 0) {
            local_c0 = 1000000;
          }
          else {
            iVar6 = local_f0->Id;
            if (((long)iVar6 < 0) || (p->vRequired->nSize <= iVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            local_c0 = p->vRequired->pArray[iVar6];
          }
          iVar6 = clock_gettime(3,&local_110);
          if (iVar6 < 0) {
            lVar17 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
            lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_110.tv_sec * -1000000;
          }
          pIVar10 = Ivy_NodeFindCutsAll(p,local_f0,5);
          iVar6 = clock_gettime(3,&local_110);
          if (iVar6 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
          }
          p_00->timeCut = p_00->timeCut + lVar18 + lVar17;
          iVar6 = clock_gettime(3,&local_110);
          if (iVar6 < 0) {
            local_80 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
            local_80 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_110.tv_sec * -1000000;
          }
          if (pIVar10->nCuts < 2) {
            iVar6 = -1;
            uVar15 = 0;
          }
          else {
            pIVar20 = pIVar10->pCuts;
            piVar27 = pIVar10->pCuts[1].pArray;
            local_e4 = 0;
            iVar6 = -1;
            lVar17 = 1;
            local_f8 = -1;
            local_d8 = pIVar10;
            local_b8 = pIVar20;
            do {
              local_d0 = lVar17;
              if (pIVar20[lVar17].nSize == 4) {
                lVar18 = 0;
                do {
                  iVar8 = piVar27[lVar18];
                  if (((long)iVar8 < 0) || (p->vObjs->nSize <= iVar8)) goto LAB_007dd8ed;
                  if ((*(uint *)((long)p->vObjs->pArray[iVar8] + 8) & 0xf) == 7) goto LAB_007dcca8;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 4);
                lVar18 = 4;
LAB_007dcca8:
                if ((int)lVar18 == 4) {
                  p_00->nCutsGood = p_00->nCutsGood + 1;
                  local_c4 = iVar6;
                  local_b0 = piVar27;
                  iVar6 = clock_gettime(3,&local_110);
                  if (iVar6 < 0) {
                    lVar18 = 1;
                  }
                  else {
                    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                    lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_110.tv_sec * -1000000;
                  }
                  if (5 < pIVar20[lVar17].nSize) {
                    __assert_fail("nNums < 6",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                  ,0x15a,"unsigned int Ivy_NodeGetTruth(Ivy_Obj_t *, int *, int)");
                  }
                  uVar7 = Ivy_NodeGetTruth_rec
                                    (local_f0,pIVar20[lVar17].pArray,(int)pIVar20[lVar17].nSize);
                  iVar6 = clock_gettime(3,&local_110);
                  if (iVar6 < 0) {
                    lVar19 = -1;
                  }
                  else {
                    lVar19 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                  }
                  p_00->timeTruth = p_00->timeTruth + lVar19 + lVar18;
                  local_78 = (ulong)(uVar7 & 0xffff);
                  pcVar3 = p_00->pPerms4[p_00->pPerms[local_78]];
                  cVar1 = p_00->pPhases[local_78];
                  pVVar14 = p_00->vFaninsCur;
                  pVVar14->nSize = 0;
                  sVar2 = pIVar20[lVar17].nSize;
                  uVar7 = (uint)sVar2;
                  if (pVVar14->nCap < (int)uVar7) {
                    if (pVVar14->pArray == (void **)0x0) {
                      ppvVar11 = (void **)malloc((long)(int)uVar7 << 3);
                    }
                    else {
                      ppvVar11 = (void **)realloc(pVVar14->pArray,(long)(int)uVar7 << 3);
                    }
                    pVVar14->pArray = ppvVar11;
                    pVVar14->nCap = uVar7;
                  }
                  p_00 = local_a8;
                  if (0 < sVar2) {
                    uVar15 = 0;
                    do {
                      pVVar14->pArray[uVar15] = (void *)0x0;
                      uVar15 = uVar15 + 1;
                    } while (uVar7 != uVar15);
                  }
                  pVVar14->nSize = uVar7;
                  sVar2 = pIVar20[lVar17].nSize;
                  if (0 < (long)sVar2) {
                    lVar18 = 0;
                    do {
                      iVar6 = pIVar20[lVar17].pArray[pcVar3[lVar18]];
                      if (((long)iVar6 < 0) || (p->vObjs->nSize <= iVar6)) {
LAB_007dd8ed:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                      }
                      pvVar24 = p->vObjs->pArray[iVar6];
                      uVar7 = *(uint *)((long)pvVar24 + 8) & 0xf;
                      if (((uVar7 - 7 < 0xfffffffe) && (uVar7 != 1)) && (uVar7 != 4)) {
                        __assert_fail("Ivy_ObjIsNode(pFanin) || Ivy_ObjIsCi(pFanin)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                      ,0xcf,
                                      "int Ivy_NodeRewrite(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, int, int)"
                                     );
                      }
                      if (local_a8->vFaninsCur->nSize <= lVar18) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                      }
                      local_a8->vFaninsCur->pArray[lVar18] =
                           (void *)((ulong)pvVar24 ^
                                   (ulong)(((uint)(int)cVar1 >> ((uint)lVar18 & 0x1f) & 1) != 0));
                      lVar18 = lVar18 + 1;
                    } while (sVar2 != lVar18);
                  }
                  local_68 = (int)cVar1;
                  iVar6 = clock_gettime(3,&local_110);
                  if (iVar6 < 0) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_110.tv_sec * -1000000;
                  }
                  lVar18 = (long)p_00->vFaninsCur->nSize;
                  if (0 < lVar18) {
                    ppvVar11 = p_00->vFaninsCur->pArray;
                    lVar19 = 0;
                    do {
                      piVar27 = (int *)(((ulong)ppvVar11[lVar19] & 0xfffffffffffffffe) + 0xc);
                      *piVar27 = *piVar27 + 1;
                      lVar19 = lVar19 + 1;
                    } while (lVar18 != lVar19);
                  }
                  Ivy_ManIncrementTravId(p);
                  local_bc = Ivy_ObjMffcLabel(p,local_f0);
                  lVar18 = (long)p_00->vFaninsCur->nSize;
                  if (0 < lVar18) {
                    ppvVar11 = p_00->vFaninsCur->pArray;
                    lVar19 = 0;
                    do {
                      uVar15 = (ulong)ppvVar11[lVar19] & 0xfffffffffffffffe;
                      iVar6 = *(int *)(uVar15 + 0xc);
                      if (iVar6 < 1) {
                        __assert_fail("pObj->nRefs > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                      ,0x10a,"void Ivy_ObjRefsDec(Ivy_Obj_t *)");
                      }
                      *(int *)(uVar15 + 0xc) = iVar6 + -1;
                      lVar19 = lVar19 + 1;
                    } while (lVar18 != lVar19);
                  }
                  iVar6 = clock_gettime(3,&local_110);
                  if (iVar6 < 0) {
                    lVar18 = -1;
                  }
                  else {
                    lVar18 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                  }
                  p_00->timeMffc = p_00->timeMffc + lVar18 + lVar17;
                  iVar6 = clock_gettime(3,&local_110);
                  if (iVar6 < 0) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
                    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_110.tv_sec * -1000000;
                  }
                  if (p_00->vClasses->nSize <= (int)(uint)p_00->pMap[local_78]) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                  }
                  pVVar14 = p_00->vFaninsCur;
                  pvVar24 = p_00->vClasses->pArray[p_00->pMap[local_78]];
                  iVar6 = *(int *)((long)pvVar24 + 4);
                  p_00->nSubgraphs = p_00->nSubgraphs + iVar6;
                  local_58 = lVar17;
                  if (iVar6 < 1) {
                    local_f4 = -1;
                    local_90 = (int *)0x0;
                  }
                  else {
                    local_f4 = -1;
                    lVar17 = 0;
                    local_90 = (int *)0x0;
                    local_a0 = pvVar24;
                    do {
                      piVar27 = *(int **)(*(long *)(*(long *)((long)pvVar24 + 8) + lVar17 * 8) +
                                         0x20);
                      if (0 < pVVar14->nSize) {
                        lVar18 = 1;
                        lVar19 = 0;
                        do {
                          *(void **)(*(long *)(piVar27 + 4) + lVar18 * 8) = pVVar14->pArray[lVar19];
                          lVar19 = lVar19 + 1;
                          lVar18 = lVar18 + 3;
                        } while (lVar19 < pVVar14->nSize);
                      }
                      iVar6 = 0;
                      if ((*piVar27 == 0) &&
                         (uVar7 = piVar27[1], uVar7 <= ((uint)piVar27[6] >> 1 & 0x3fffffff))) {
                        if (0 < (int)uVar7) {
                          lVar18 = 0x10;
                          lVar19 = 0;
                          do {
                            lVar4 = *(long *)(piVar27 + 4);
                            *(uint *)(lVar4 + lVar18) =
                                 *(uint *)(lVar4 + lVar18) & 0xffffc000 |
                                 *(uint *)((*(ulong *)(lVar4 + -8 + lVar18) & 0xfffffffffffffffe) +
                                          8) >> 0xb & 0x3fff;
                            lVar19 = lVar19 + 1;
                            uVar7 = piVar27[1];
                            lVar18 = lVar18 + 0x18;
                          } while (lVar19 < (int)uVar7);
                        }
                        iVar6 = 0;
                        if ((int)uVar7 < piVar27[2]) {
                          lVar19 = (long)(int)uVar7;
                          lVar18 = lVar19 * 0x18 + 0x10;
                          iVar6 = 0;
                          local_98 = lVar17;
                          do {
                            lVar4 = *(long *)(piVar27 + 4);
                            uVar7 = *(uint *)(lVar4 + -0x10 + lVar18);
                            uVar22 = *(uint *)(lVar4 + -0xc + lVar18);
                            uVar15 = (ulong)(uVar7 >> 1 & 0x3fffffff);
                            lVar17 = uVar15 * 3;
                            uVar16 = (ulong)(uVar22 >> 1 & 0x3fffffff);
                            lVar26 = uVar16 * 3;
                            pIVar23 = *(Ivy_Obj_t **)(lVar4 + 8 + uVar15 * 0x18);
                            pIVar5 = *(Ivy_Obj_t **)(lVar4 + 8 + uVar16 * 0x18);
                            local_38 = lVar19;
                            if ((pIVar23 != (Ivy_Obj_t *)0x0) && (pIVar5 != (Ivy_Obj_t *)0x0)) {
                              piVar25 = (int *)((ulong)pIVar23 & 0xfffffffffffffffe);
                              local_64 = iVar6;
                              if (*piVar25 == 0) {
                                __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                              ,0x137,
                                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                             );
                              }
                              pIVar13 = (Ivy_Obj_t *)(ulong)(uVar22 & 1);
                              if ((pIVar13 != pIVar5) &&
                                 (*(int *)((ulong)pIVar5 & 0xfffffffffffffffe) == 0)) {
                                __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                              ,0x138,
                                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                             );
                              }
                              local_48 = lVar26;
                              local_40 = lVar17;
                              if (piVar25 == (int *)((ulong)pIVar5 & 0xfffffffffffffffe)) {
                                __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivy.h"
                                              ,0x139,
                                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                                             );
                              }
                              pIVar12 = (Ivy_Obj_t *)(ulong)(uVar7 & 1);
                              pIVar21 = (Ivy_Obj_t *)((ulong)pIVar23 ^ (ulong)pIVar12);
                              pIVar28 = (Ivy_Obj_t *)((ulong)pIVar5 ^ (ulong)pIVar13);
                              *(uint *)&(p->Ghost).field_0x8 =
                                   *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 5;
                              (p->Ghost).pFanin0 = pIVar21;
                              (p->Ghost).pFanin1 = pIVar28;
                              if (pIVar13 != pIVar5) {
                                iVar6 = 0;
                                if (pIVar12 != pIVar23) {
                                  iVar6 = *piVar25;
                                }
                                if (*(int *)((ulong)pIVar5 & 0xfffffffffffffffe) < iVar6) {
                                  (p->Ghost).pFanin0 = pIVar28;
                                  (p->Ghost).pFanin1 = pIVar21;
                                }
                              }
                              pIVar13 = Ivy_TableLookup(p,local_50);
                              p_00 = local_a8;
                              lVar17 = local_40;
                              lVar26 = local_48;
                              iVar6 = local_64;
                              if (local_f0 != (Ivy_Obj_t *)((ulong)pIVar13 & 0xfffffffffffffffe))
                              goto LAB_007dd25a;
LAB_007dd374:
                              iVar6 = -1;
                              pvVar24 = local_a0;
                              lVar17 = local_98;
                              break;
                            }
                            pIVar13 = (Ivy_Obj_t *)0x0;
                            pIVar21 = pIVar23;
                            pIVar28 = pIVar5;
LAB_007dd25a:
                            if ((pIVar13 == (Ivy_Obj_t *)0x0) ||
                               (*(int *)(((ulong)pIVar13 & 0xfffffffffffffffe) + 4) == p->nTravIds))
                            {
                              if (local_bc <= iVar6) goto LAB_007dd374;
                              iVar6 = iVar6 + 1;
                            }
                            uVar22 = *(uint *)(lVar17 * 8 + lVar4 + 0x10) & 0x3fff;
                            uVar7 = *(uint *)(lVar26 * 8 + lVar4 + 0x10) & 0x3fff;
                            if (uVar7 < uVar22) {
                              uVar7 = uVar22;
                            }
                            uVar7 = uVar7 + 1;
                            if (pIVar13 != (Ivy_Obj_t *)0x0) {
                              pIVar23 = (Ivy_Obj_t *)((ulong)pIVar13 & 0xfffffffffffffffe);
                              if (p->pConst1 == pIVar23) {
                                uVar7 = 0;
                              }
                              else {
                                pIVar21 = (Ivy_Obj_t *)((ulong)pIVar21 & 0xfffffffffffffffe);
                                if ((pIVar23 == pIVar21) ||
                                   (pIVar21 = (Ivy_Obj_t *)((ulong)pIVar28 & 0xfffffffffffffffe),
                                   pIVar23 == pIVar21)) {
                                  uVar7 = *(uint *)&pIVar21->field_0x8 >> 0xb;
                                }
                              }
                            }
                            pvVar24 = local_a0;
                            lVar17 = local_98;
                            if (local_c0 < (int)uVar7) {
                              iVar6 = -1;
                              break;
                            }
                            *(Ivy_Obj_t **)(lVar4 + -8 + lVar18) = pIVar13;
                            *(uint *)(lVar4 + lVar18) =
                                 *(uint *)(lVar4 + lVar18) & 0xffffc000 | uVar7 & 0x3fff;
                            lVar19 = local_38 + 1;
                            lVar18 = lVar18 + 0x18;
                          } while (lVar19 < piVar27[2]);
                        }
                      }
                      if (iVar6 != -1) {
                        iVar8 = local_bc - iVar6;
                        if (local_bc < iVar6) {
                          __assert_fail("nNodesSaved >= nNodesAdded",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyRwr.c"
                                        ,0x180,
                                        "Dec_Graph_t *Rwt_CutEvaluate(Ivy_Man_t *, Rwt_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, int, int, int *, unsigned int)"
                                       );
                        }
                        if (local_f4 < iVar8) {
                          local_90 = piVar27;
                        }
                        if (local_f4 <= iVar8) {
                          local_f4 = iVar8;
                        }
                      }
                      lVar17 = lVar17 + 1;
                    } while (lVar17 < *(int *)((long)pvVar24 + 4));
                  }
                  if (local_f4 != -1) {
                    local_f8 = local_f4;
                  }
                  piVar25 = (int *)0x0;
                  if (local_f4 != -1) {
                    piVar25 = local_90;
                  }
                  iVar6 = clock_gettime(3,&local_110);
                  if (iVar6 < 0) {
                    lVar17 = -1;
                  }
                  else {
                    lVar17 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
                  }
                  p_00->timeEval = p_00->timeEval + lVar17 + local_58;
                  pIVar20 = local_b8;
                  pIVar10 = local_d8;
                  piVar27 = local_b0;
                  iVar6 = local_c4;
                  if ((piVar25 != (int *)0x0) && (local_c4 < local_f8)) {
                    p_00->pGraph = piVar25;
                    p_00->fCompl = local_68 >> 4 & 1;
                    p_00->vFanins->nSize = 0;
                    pVVar14 = p_00->vFaninsCur;
                    if (pVVar14->nSize < 1) {
                      local_e4 = (uint)local_78;
                      iVar6 = local_f8;
                    }
                    else {
                      lVar17 = 0;
                      do {
                        pvVar24 = pVVar14->pArray[lVar17];
                        pVVar14 = p_00->vFanins;
                        uVar7 = pVVar14->nCap;
                        if (pVVar14->nSize == uVar7) {
                          if ((int)uVar7 < 0x10) {
                            if (pVVar14->pArray == (void **)0x0) {
                              ppvVar11 = (void **)malloc(0x80);
                            }
                            else {
                              ppvVar11 = (void **)realloc(pVVar14->pArray,0x80);
                            }
                            pVVar14->pArray = ppvVar11;
                            iVar6 = 0x10;
                          }
                          else {
                            iVar6 = uVar7 * 2;
                            if (iVar6 <= (int)uVar7) goto LAB_007dd539;
                            if (pVVar14->pArray == (void **)0x0) {
                              ppvVar11 = (void **)malloc((ulong)uVar7 << 4);
                            }
                            else {
                              ppvVar11 = (void **)realloc(pVVar14->pArray,(ulong)uVar7 << 4);
                            }
                            pVVar14->pArray = ppvVar11;
                          }
                          pVVar14->nCap = iVar6;
                          piVar27 = local_b0;
                        }
LAB_007dd539:
                        iVar6 = pVVar14->nSize;
                        pVVar14->nSize = iVar6 + 1;
                        pVVar14->pArray[iVar6] = pvVar24;
                        lVar17 = lVar17 + 1;
                        pVVar14 = p_00->vFaninsCur;
                      } while (lVar17 < pVVar14->nSize);
                      local_e4 = (uint)local_78;
                      pIVar20 = local_b8;
                      pIVar10 = local_d8;
                      iVar6 = local_f8;
                    }
                  }
                }
                else {
                  p_00->nCutsBad = p_00->nCutsBad + 1;
                  pIVar20 = local_b8;
                  pIVar10 = local_d8;
                }
              }
              lVar17 = local_d0 + 1;
              piVar27 = piVar27 + 9;
            } while (lVar17 < pIVar10->nCuts);
            uVar15 = (ulong)local_e4;
          }
          iVar8 = clock_gettime(3,&local_110);
          if (iVar8 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
          }
          p_00->timeRes = p_00->timeRes + lVar17 + local_80;
          if (iVar6 == -1) {
            iVar6 = -1;
          }
          else {
            pVVar14 = p_00->vFanins;
            if (0 < pVVar14->nSize) {
              lVar17 = 1;
              lVar18 = 0;
              do {
                *(void **)(*(long *)((long)p_00->pGraph + 0x10) + lVar17 * 8) =
                     pVVar14->pArray[lVar18];
                lVar18 = lVar18 + 1;
                pVVar14 = p_00->vFanins;
                lVar17 = lVar17 + 3;
              } while (lVar18 < pVVar14->nSize);
            }
            p_00->nScores[p_00->pMap[uVar15]] = p_00->nScores[p_00->pMap[uVar15]] + 1;
            p_00->nNodesGained = p_00->nNodesGained + iVar6;
            if ((local_c8 != 0) || (0 < iVar6)) {
              p_00->nNodesRewritten = p_00->nNodesRewritten + 1;
            }
          }
          if ((0 < iVar6) || (uVar15 = local_e0, local_c8 != 0 && iVar6 == 0)) {
            pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(p_00);
            iVar8 = Rwt_ManReadCompl(p_00);
            iVar9 = clock_gettime(3,&local_110);
            if (iVar9 < 0) {
              lVar17 = 1;
            }
            else {
              lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_110.tv_nsec),8);
              lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_110.tv_sec * -1000000;
            }
            if (iVar8 == 0) {
              Ivy_GraphUpdateNetwork(p,local_f0,pGraph,local_fc,iVar6);
            }
            else {
              *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
              Ivy_GraphUpdateNetwork(p,local_f0,pGraph,local_fc,iVar6);
              *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot ^ 1;
            }
            iVar6 = clock_gettime(3,&local_110);
            if (iVar6 < 0) {
              lVar18 = -1;
            }
            else {
              lVar18 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
            }
            Rwt_ManAddTimeUpdate(p_00,lVar18 + lVar17);
            uVar15 = local_e0;
          }
        }
        uVar15 = uVar15 + 1;
        pVVar14 = p->vObjs;
      } while ((long)uVar15 < (long)pVVar14->nSize);
    }
    iVar6 = clock_gettime(3,&local_110);
    if (iVar6 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_110.tv_nsec / 1000 + local_110.tv_sec * 1000000;
    }
    Rwt_ManAddTimeTotal(p_00,lVar17 + local_88);
    if (local_6c != 0) {
      Rwt_ManPrintStats(p_00);
    }
    Rwt_ManStop(p_00);
    p->pData = (void *)0x0;
    if (local_fc == 0) {
      Ivy_ManResetLevels(p);
    }
    else {
      __ptr = p->vRequired;
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
      p->vRequired = (Vec_Int_t *)0x0;
    }
    uVar7 = Ivy_ManCleanup(p);
    if (uVar7 != 0) {
      printf("Cleanup after rewriting removed %d dangling nodes.\n",(ulong)uVar7);
    }
    iVar8 = Ivy_ManCheck(p);
    iVar6 = 1;
    if (iVar8 == 0) {
      puts("Ivy_ManRewritePre(): The check has failed.");
    }
  }
  return iVar6;
}

Assistant:

int Ivy_ManRewritePre( Ivy_Man_t * p, int fUpdateLevel, int fUseZeroCost, int fVerbose )
{
    Rwt_Man_t * pManRwt;
    Ivy_Obj_t * pNode;
    int i, nNodes, nGain;
    abctime clk, clkStart = Abc_Clock();
    // start the rewriting manager
    pManRwt = Rwt_ManStart( 0 );
    p->pData = pManRwt;
    if ( pManRwt == NULL )
        return 0; 
    // create fanouts
    if ( fUpdateLevel && p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Ivy_ManRequiredLevels( p );
    // set the number of levels
//    p->nLevelMax = Ivy_ManLevels( p );
    // resynthesize each node once
    nNodes = Ivy_ManObjIdMax(p);
    Ivy_ManForEachNode( p, pNode, i )
    {
        // fix the fanin buffer problem
        Ivy_NodeFixBufferFanins( p, pNode, 1 );
        if ( Ivy_ObjIsBuf(pNode) )
            continue;
        // stop if all nodes have been tried once
        if ( i > nNodes )
            break;
        // for each cut, try to resynthesize it
        nGain = Ivy_NodeRewrite( p, pManRwt, pNode, fUpdateLevel, fUseZeroCost );
        if ( nGain > 0 || (nGain == 0 && fUseZeroCost) )
        {
            Dec_Graph_t * pGraph = (Dec_Graph_t *)Rwt_ManReadDecs(pManRwt);
            int fCompl           = Rwt_ManReadCompl(pManRwt);
/*
            {
                Ivy_Obj_t * pObj;
                int i;
                printf( "USING: (" );
                Vec_PtrForEachEntry( Ivy_Obj_t *, Rwt_ManReadLeaves(pManRwt), pObj, i )
                    printf( "%d ", Ivy_ObjFanoutNum(Ivy_Regular(pObj)) );
                printf( ")   Gain = %d.\n", nGain );
            }
            if ( nGain > 0 )
            { // print stats on the MFFC
                extern void Ivy_NodeMffcConeSuppPrint( Ivy_Obj_t * pNode );
                printf( "Node %6d : Gain = %4d  ", pNode->Id, nGain );
                Ivy_NodeMffcConeSuppPrint( pNode );
            }
*/
            // complement the FF if needed
clk = Abc_Clock();
            if ( fCompl ) Dec_GraphComplement( pGraph );
            Ivy_GraphUpdateNetwork( p, pNode, pGraph, fUpdateLevel, nGain );
            if ( fCompl ) Dec_GraphComplement( pGraph );
Rwt_ManAddTimeUpdate( pManRwt, Abc_Clock() - clk );
        }
    }
Rwt_ManAddTimeTotal( pManRwt, Abc_Clock() - clkStart );
    // print stats
    if ( fVerbose )
        Rwt_ManPrintStats( pManRwt );
    // delete the managers
    Rwt_ManStop( pManRwt );
    p->pData = NULL;
    // fix the levels
    if ( fUpdateLevel )
        Vec_IntFree( p->vRequired ), p->vRequired = NULL;
    else
        Ivy_ManResetLevels( p );
    // check
    if ( (i = Ivy_ManCleanup(p)) )
        printf( "Cleanup after rewriting removed %d dangling nodes.\n", i );
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManRewritePre(): The check has failed.\n" );
    return 1;
}